

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O3

int domonnoise(monst *mtmp)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  obj *poVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  trap *ptVar10;
  char **ppcVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  permonst *ppVar15;
  long amount;
  char *pcVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  char verbuf [256];
  char local_128 [24];
  undefined2 uStack_110;
  undefined6 local_10e;
  undefined2 uStack_108;
  char acStack_106 [222];
  
  if (flags.soundok == '\0') {
    return 0;
  }
  ppVar15 = mtmp->data;
  if (ppVar15->msound == '\0') {
    return 0;
  }
  if (ppVar15 != &pm_guardian && ppVar15->msound == '!') {
    iVar3 = monsndx(ppVar15);
    iVar3 = genus(iVar3,1);
    ppVar15 = mons + iVar3;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00246ed6;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00246ecd;
      }
      else {
LAB_00246ecd:
        if (ublindf == (obj *)0x0) goto LAB_00246f86;
LAB_00246ed6:
        if (ublindf->oartifact != '\x1d') goto LAB_00246f86;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)
          ) || ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_00246f86;
    }
LAB_00246f31:
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((((uVar5 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_00246f79;
      goto LAB_00246f86;
    }
    if ((uVar5 & 0x280) != 0) goto LAB_00246f86;
LAB_00246f79:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_00246f86;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') goto LAB_00246f31;
LAB_00246f86:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
        (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00246fde;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00246fd9;
      }
      else {
LAB_00246fd9:
        if (ublindf != (obj *)0x0) {
LAB_00246fde:
          if (ublindf->oartifact == '\x1d') goto LAB_00247071;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_002470e5;
      }
LAB_00247071:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
      goto LAB_002470e5;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
      map_invisible(mtmp->mx,mtmp->my);
    }
  }
LAB_002470e5:
  switch(ppVar15->msound) {
  case '\x01':
    if ((flags.moonphase == 4) && (iVar3 = night(), iVar3 != 0)) {
      pcVar16 = "howls.";
    }
    else if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      pcVar16 = "growls.";
    }
    else if (mtmp->mtame == '\0') {
LAB_00247ba0:
      if (mtmp->data == mons + 0x15) {
        return 1;
      }
      pcVar16 = "barks.";
    }
    else {
      pcVar16 = "whines.";
      if (((*(uint *)&mtmp->field_0x60 & 0xa10000) == 0) &&
         (uVar5 = *(uint *)((long)&mtmp[1].data + 4), '\x04' < mtmp->mtame && moves <= uVar5)) {
        if (uVar5 <= moves + 1000) goto LAB_00247ba0;
        pcVar16 = "yips.";
      }
    }
    break;
  case '\x02':
    if (mtmp->mtame == '\0') {
LAB_0024768c:
      bVar1 = mtmp->field_0x62;
      pcVar7 = "growls!";
      goto LAB_00247697;
    }
    pcVar16 = "yowls.";
    if (('\x04' < mtmp->mtame) && ((*(uint *)&mtmp->field_0x60 & 0xa10000) == 0)) {
      uVar5 = *(uint *)((long)&mtmp[1].data + 4);
      if (moves <= uVar5) {
        bVar18 = uVar5 < moves + 1000;
        bVar17 = uVar5 == moves + 1000;
        pcVar7 = "purrs.";
        pcVar16 = "mews.";
        goto LAB_00247cac;
      }
      pcVar16 = "meows.";
    }
    break;
  case '\x03':
    bVar1 = mtmp->field_0x62;
    pcVar7 = "roars!";
LAB_00247697:
    pcVar16 = "snarls.";
    goto LAB_0024769e;
  case '\x04':
    if ((mtmp->mtame == '\0') ||
       (ppVar15 = mtmp->data,
       ppVar15 != mons + 0xf3 && (ppVar15 != mons + 0xf0 && ppVar15 != mons + 0xef)))
    goto LAB_0024768c;
    if (((mtmp->field_0x62 & 0xa1) == 0) &&
       (uVar5 = *(uint *)((long)&mtmp[1].data + 4), '\x04' < mtmp->mtame && moves <= uVar5)) {
      bVar18 = uVar5 < moves + 1000;
      bVar17 = uVar5 == moves + 1000;
      pcVar7 = "chatters.";
      pcVar16 = "hoots.";
      goto LAB_00247cac;
    }
    wake_nearto((int)mtmp->mx,(int)mtmp->my,0x40);
    goto LAB_00247680;
  case '\x05':
    pcVar16 = "squeaks.";
    break;
  case '\x06':
    pcVar16 = "squawks.";
    if ((ppVar15 == mons + 0x84) && ((mtmp->field_0x62 & 0x40) == 0)) {
      pcVar16 = "Nevermore!";
      goto LAB_00247d83;
    }
    break;
  case '\a':
    if ((mtmp->field_0x62 & 0x40) != 0) {
      return 0;
    }
    pcVar16 = "hisses!";
    break;
  case '\b':
    bVar1 = mtmp->field_0x62;
    pcVar7 = "buzzes angrily.";
    pcVar16 = "drones.";
LAB_0024769e:
    if ((bVar1 & 0x40) == 0) {
      pcVar16 = pcVar7;
    }
    break;
  case '\t':
    pcVar16 = "grunts.";
    break;
  case '\n':
    if (mtmp->mtame < '\x05') {
      pcVar16 = "neighs.";
    }
    else {
      uVar5 = *(uint *)((long)&mtmp[1].data + 4);
      bVar18 = moves < uVar5;
      bVar17 = moves == uVar5;
      pcVar7 = "whinnies.";
      pcVar16 = "whickers.";
LAB_00247cac:
      if (!bVar18 && !bVar17) {
        pcVar16 = pcVar7;
      }
    }
    break;
  case '\v':
    pcVar16 = "wails mournfully.";
    break;
  case '\f':
    goto switchD_00247103_caseD_c;
  case '\r':
    pcVar16 = "burbles.";
    break;
  default:
    goto switchD_00247103_caseD_e;
  case '\x0f':
    aggravate();
LAB_00247680:
    pcVar16 = "shrieks.";
    break;
  case '\x10':
    pcVar16 = Monnam(mtmp);
    pline("%s rattles noisily.",pcVar16);
    pline("You freeze for a moment.");
    nomul(-2,"scared by rattling");
    return 1;
  case '\x11':
    uVar5 = mt_random();
    pcVar16 = domonnoise_laugh_msg_rel + *(int *)(domonnoise_laugh_msg_rel + (ulong)(uVar5 & 3) * 4)
    ;
    break;
  case '\x12':
    pcVar16 = "mumbles incomprehensibly.";
    break;
  case '\x13':
    pcVar16 = "imitates you.";
    break;
  case '\x14':
    uVar5 = *(uint *)&mtmp->field_0x60;
LAB_00247547:
    if ((uVar5 >> 0x16 & 1) == 0) {
      if ((ppVar15 <= mons + 0x168 && mons + 0x159 <= ppVar15) &&
          u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
        mplayer_talk(mtmp);
        return 1;
      }
      return 0;
    }
    if ((uVar5 >> 0x10 & 1) == 0) {
      iVar3 = mtmp->mhpmax;
      iVar13 = iVar3 + 3;
      if (-1 < iVar3) {
        iVar13 = iVar3;
      }
      if (mtmp->mhp < iVar13 >> 2) {
        pcVar16 = "moans.";
      }
      else {
        if ((uVar5 & 0x300000) != 0) {
          uVar5 = mt_random();
          if (uVar5 * -0x55555555 < 0x55555556) {
            pcVar16 = "Huh?";
            goto LAB_00247d83;
          }
          uVar5 = mt_random();
          bVar18 = (uVar5 & 1) == 0;
          pcVar7 = "Eh?";
          pcVar16 = "What?";
          goto LAB_00247a65;
        }
        if ((uVar5 >> 0x11 & 1) == 0) {
          pcVar16 = "I can\'t see!";
          goto LAB_00247d83;
        }
        if ((uVar5 >> 0x17 & 1) != 0) {
          ptVar10 = t_at(level,(int)mtmp->mx,(int)mtmp->my);
          pcVar16 = "I\'m trapped!";
          if (ptVar10 != (trap *)0x0) {
            ptVar10->field_0x8 = ptVar10->field_0x8 | 0x20;
          }
          goto LAB_00247d83;
        }
        if (mtmp->mhp < iVar3 / 2) {
          pcVar16 = "asks for a potion of healing.";
        }
        else {
          if ((((uVar5 >> 0x1a & 1) == 0) && (mtmp->mtame != '\0')) &&
             (*(uint *)((long)&mtmp[1].data + 4) < moves)) {
            pcVar16 = "I\'m hungry.";
            goto LAB_00247d83;
          }
          uVar5 = ppVar15->mflags2;
          if ((uVar5 & 0x10) == 0) {
            if ((uVar5 & 0x20) == 0) {
              if ((int)uVar5 < 0) {
                pcVar16 = "talks about spellcraft.";
              }
              else if (ppVar15->mlet == '\x1d') {
                pcVar16 = "discusses hunting.";
              }
              else {
                iVar3 = monsndx(ppVar15);
                if (iVar3 == 0x166) {
                  pcVar16 = "Aloha.";
                  goto LAB_00247d83;
                }
                if (iVar3 == 0x159) {
                  pcVar16 = "describes a recent article in \"Spelunker Today\" magazine.";
                }
                else if (iVar3 == 0x2c) {
                  pcVar16 = "asks you about the One Ring.";
                  if (9 < mtmp->mhpmax - mtmp->mhp) {
                    pcVar16 = "complains about unpleasant dungeon conditions.";
                  }
                }
                else {
                  pcVar16 = "discusses dungeon exploration.";
                }
              }
            }
            else {
              pcVar16 = "talks about mining.";
            }
          }
          else {
            pcVar16 = "curses orcs.";
          }
        }
      }
    }
    else {
      pcVar16 = "wants nothing to do with you.";
    }
    break;
  case '\x15':
    if ((mtmp->field_0x62 & 0x40) != 0) {
      pcVar16 = "Ma\'am";
      if (flags.female == '\0') {
        pcVar16 = "Sir";
      }
      verbalize("Just the facts, %s.",pcVar16);
      return 1;
    }
    uVar5 = mt_random();
    ppcVar11 = domonnoise::arrest_msg + uVar5 % 3;
    goto LAB_0024772e;
  case '\x16':
    ppcVar11 = domonnoise::soldier_pax_msg;
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      ppcVar11 = domonnoise::soldier_foe_msg;
    }
    uVar5 = mt_random();
    ppcVar11 = ppcVar11 + uVar5 % 3;
LAB_0024772e:
    pcVar16 = *ppcVar11;
    if (*ppcVar11 == (char *)0x0) {
      return 1;
    }
    goto LAB_00247d83;
  case '\x17':
    lVar8 = money_cnt(invent);
    bVar18 = lVar8 == 0;
    pcVar7 = "Please follow me.";
    pcVar16 = "Please drop that gold and follow me.";
    goto LAB_00247a65;
  case '\x18':
    if (mtmp->mtame != '\0') {
      pcVar16 = "Sorry, I\'m all out of wishes.";
      goto LAB_00247d83;
    }
    if ((mtmp->field_0x62 & 0x40) == 0) {
      pcVar16 = "This will teach you not to disturb me!";
      goto LAB_00247d83;
    }
    if (ppVar15 != mons + 300) {
      pcVar16 = "I\'m free!";
      goto LAB_00247d83;
    }
    goto switchD_00247103_caseD_c;
  case '\x19':
    lVar8 = CONCAT44(uwep._4_4_,(int)uwep);
    if (lVar8 != 0) {
      pcVar16 = "Put that weapon away before you hurt someone!";
      if ((*(char *)(lVar8 + 0x35) == '\x02') ||
         ((*(char *)(lVar8 + 0x35) == '\x06' &&
          (objects[*(short *)(lVar8 + 0x2a)].oc_subtyp != '\0')))) goto LAB_00247d83;
    }
    auVar19._0_4_ = -(uint)((int)uarmc == 0 && (int)uarmh == 0);
    auVar19._4_4_ = -(uint)(uarmc._4_4_ == 0 && uarmh._4_4_ == 0);
    auVar19._8_4_ = -(uint)((int)uwep == 0 && (int)uarmh == 0);
    auVar19._12_4_ = -(uint)(uwep._4_4_ == 0 && uarmh._4_4_ == 0);
    iVar3 = movmskps(0x31da88,auVar19);
    if ((iVar3 == 0xf) && ((uarmg == (obj *)0x0 && (uarmf == (obj *)0x0)))) {
      bVar18 = uarmu == (obj *)0x0;
      pcVar7 = "Relax, this won\'t hurt a bit.";
      pcVar16 = "Take off your shirt, please.";
    }
    else {
      bVar18 = urole.malenum == 0x15e;
      pcVar7 = "Doc, I can\'t help you unless you cooperate.";
      pcVar16 = "Please undress so I can examine you.";
    }
LAB_00247a65:
    if (bVar18) {
      pcVar16 = pcVar7;
    }
LAB_00247d83:
    verbalize(pcVar16);
    return 1;
  case '\x1a':
    if (((ppVar15->mlet != '\x0e') && (flags.seduce_enabled != '\0')) &&
       (iVar3 = could_seduce(mtmp,&youmonst,(attack *)0x0), iVar3 == 1)) {
      doseduce(mtmp);
      return 1;
    }
    uVar5 = poly_gender();
    if (uVar5 != (*(uint *)&mtmp->field_0x60 & 1)) {
      uVar5 = mt_random();
      if (uVar5 % 3 == 1) {
        pcVar16 = "comes on to you.";
        break;
      }
      if (uVar5 % 3 == 2) {
        pcVar16 = "Hello, sailor.";
        goto LAB_00247d83;
      }
    }
    pcVar16 = "cajoles you.";
    break;
  case '\x1b':
    iVar3 = night();
    bVar18 = (u.umonnum & 0xfffffffeU) == 0xe8;
    if (u.umonnum == u.umonster) {
      bVar18 = urace.malenum == 0xe8;
    }
    if (0x1a < (uint)u.umonnum || u.umonnum == u.umonster) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0x6400000 >> ((byte)u.umonnum & 0x1f);
    }
    pcVar16 = urace.individual.m;
    if (urace.individual.m == (char *)0x0) {
      pcVar16 = urace.noun;
    }
    pcVar7 = urace.individual.f;
    if (urace.individual.f == (char *)0x0) {
      pcVar7 = pcVar16;
    }
    if (flags.female == '\0') {
      pcVar7 = pcVar16;
    }
    cVar12 = (char)iVar3;
    if (mtmp->mtame == '\0') {
      if ((mtmp->field_0x62 & 0x40) == 0) {
        if (bVar18) {
          pcVar16 = "This is my hunting ground that you dare to prowl!";
          goto LAB_00247d83;
        }
        if (youmonst.data == mons + 0x8a || youmonst.data == mons + 0x94) {
          pcVar16 = "Young Fool";
          if (youmonst.data == mons + 0x94) {
            pcVar16 = "Fool";
          }
          pcVar7 = "%s! Your silver sheen does not frighten me!";
        }
        else {
          uVar5 = mt_random();
          if ((uVar5 & 1) == 0) {
            pcVar16 = body_part(0xf);
            pcVar7 = "I vant to suck your %s!";
          }
          else {
            if (u.umonnum != u.umonster) {
              pcVar7 = mons_mname(mons + u.umonnum);
            }
            pcVar16 = an(pcVar7);
            pcVar7 = "I vill come after %s without regret!";
          }
        }
      }
      else {
        if (!(bool)(bVar18 & cVar12 != '\0')) {
          if (((byte)uVar5 & cVar12 != '\0') == 1) {
            uStack_108 = 0x6568;
            builtin_strncpy(acStack_106," night!",8);
            builtin_strncpy(local_128 + 0x10," you, ch",8);
            uStack_110 = 0x6c69;
            local_10e = 0x7420666f2064;
            builtin_strncpy(local_128,"How nice to hear",0x10);
            pcVar16 = local_128;
          }
          else {
            pcVar16 = "I only drink... potions.";
          }
          goto LAB_00247d83;
        }
        pcVar16 = "sister";
        if (flags.female == '\0') {
          pcVar16 = "brother";
        }
        pcVar7 = "Good feeding %s!";
      }
      sprintf(local_128,pcVar7,pcVar16);
      pcVar16 = local_128;
    }
    else {
      if (bVar18) {
        pcVar16 = "evening";
        if (cVar12 == '\0') {
          pcVar16 = "day";
        }
        pcVar14 = "!";
        if (cVar12 == '\0') {
          pcVar14 = ".  Why do we not rest?";
        }
        pcVar7 = "Good %s to you Master%s";
      }
      else {
        pcVar16 = "";
        if ((uVar5 & 1) != 0) {
          pcVar16 = "Child of the night, ";
        }
        iVar3 = midnight();
        pcVar7 = "I beg you, help me satisfy this growing craving!";
        if (cVar12 == '\0') {
          pcVar7 = "I find myself growing a little weary.";
        }
        pcVar14 = "I can stand this craving no longer!";
        if (iVar3 == 0) {
          pcVar14 = pcVar7;
        }
        pcVar7 = "%s%s";
      }
      sprintf(local_128,pcVar7,pcVar16,pcVar14);
      pcVar16 = local_128;
    }
    goto LAB_00247d83;
  case '\x1c':
    iVar3 = monsndx(ppVar15);
    if (iVar3 != 0x10d) {
      uVar5 = *(uint *)&mtmp->field_0x60;
      if (((uVar5 >> 0x16 & 1) != 0) && (mtmp->mtame == '\0')) {
        demon_talk(mtmp);
        return 1;
      }
      goto LAB_00247742;
    }
    pcVar16 = "Out of my way, scum!";
    if (((mtmp->field_0x62 & 0x40) == 0) && (mtmp->mtame == '\0')) {
      lVar8 = (long)u.ulevel;
      amount = lVar8 * 500;
      pcVar16 = Amonnam(mtmp);
      pcVar7 = currency(amount);
      pline("%s demands %ld %s to avoid re-arrest.",pcVar16,amount,pcVar7);
      lVar9 = bribe(mtmp);
      if (SBORROW8(lVar9,amount) != lVar9 + lVar8 * -500 < 0) {
        verbalize("I said %ld!",amount);
        mtmp->mspec_used = 1000;
        return 1;
      }
      mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
      set_malign(mtmp);
      pcVar16 = "Good.  Now beat it, scum!";
    }
    goto LAB_00247d83;
  case '\x1d':
    uVar5 = *(uint *)&mtmp->field_0x60;
LAB_00247742:
    if ((uVar5 >> 0x16 & 1) != 0) {
      return 1;
    }
    cuss(mtmp);
    return 1;
  case '\x1e':
    if (ppVar15 != mons + 0x144) {
      pcVar16 = "Who do you think you are, War?";
      goto LAB_00247d83;
    }
    uVar5 = mt_random();
    if (0x19999999 < (uVar5 * -0x33333333 >> 1 | (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f)) {
      pcVar16 = "WHO DO YOU THINK YOU ARE, WAR?";
      goto LAB_00247d83;
    }
    pcVar16 = "is busy reading a copy of Sandman #8.";
    break;
  case '\x1f':
  case ' ':
  case '!':
    quest_chat(mtmp);
    return 1;
  case '\"':
    shk_chat(mtmp);
    return 1;
  case '#':
    iVar3 = doconsult(mtmp);
    return iVar3;
  case '$':
    priest_talk(mtmp);
    return 1;
  case '%':
    pcVar16 = "seems to mutter a cantrip.";
    break;
  case '&':
    pcVar16 = "whispers inaudibly.  All you can make out is \"moon\".";
    if (flags.moonphase == 4) {
      uVar5 = night();
      uVar4 = mt_random();
      if (uVar5 != uVar4 * -0x3b13b13b < 0x13b13b14) {
        pcVar16 = Monnam(mtmp);
        iVar3 = pronoun_gender(level,mtmp);
        pcVar7 = "howl";
        if (ppVar15 == mons + 0x10e) {
          pcVar7 = "shriek";
        }
        pline("%s throws back %s head and lets out a blood curdling %s!",pcVar16,genders[iVar3].his,
              pcVar7);
        wake_nearto((int)mtmp->mx,(int)mtmp->my,0x79);
        return 1;
      }
    }
    break;
  case '\'':
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((uVar5 >> 0x16 & 1) != 0) goto LAB_00247547;
    uVar5 = mt_random();
    if ((uVar5 & 3) == 1) {
      pcVar16 = "complains about a diet of mutton.";
      break;
    }
    if ((uVar5 & 3) != 0) {
      wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
      pcVar16 = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
      break;
    }
    pcVar7 = Monnam(mtmp);
    iVar3 = pronoun_gender(level,mtmp);
    pcVar16 = genders[iVar3].his;
    pcVar14 = "%s boasts about %s gem collection.";
    goto LAB_00247cc5;
  }
LAB_00247cb0:
  pcVar7 = Monnam(mtmp);
  pcVar14 = "%s %s";
LAB_00247cc5:
  pline(pcVar14,pcVar7,pcVar16);
switchD_00247103_caseD_e:
  return 1;
switchD_00247103_caseD_c:
  pcVar16 = "gurgles.";
  goto LAB_00247cb0;
}

Assistant:

static int domonnoise(struct monst *mtmp)
{
    const char *pline_msg = 0,	/* Monnam(mtmp) will be prepended */
			*verbl_msg = 0;	/* verbalize() */
    const struct permonst *ptr = mtmp->data;
    char verbuf[BUFSZ];

    /* presumably nearness and sleep checks have already been made */
    if (!flags.soundok) return 0;
    if (is_silent(ptr)) return 0;

    /* Make sure its your role's quest quardian; adjust if not */
    if (ptr->msound == MS_GUARDIAN && ptr != &pm_guardian) {
	int mndx = monsndx(ptr);
	ptr = &mons[genus(mndx,1)];
    }

    /* be sure to do this before talking; the monster might teleport away, in
     * which case we want to check its pre-teleport position
     */
    if (!canspotmon(level, mtmp))
	map_invisible(mtmp->mx, mtmp->my);

    switch (ptr->msound) {
	case MS_ORACLE:
	    return doconsult(mtmp);
	case MS_PRIEST:
	    priest_talk(mtmp);
	    break;
	case MS_LEADER:
	case MS_NEMESIS:
	case MS_GUARDIAN:
	    quest_chat(mtmp);
	    break;
	case MS_SELL: /* pitch, pay, total */
	    shk_chat(mtmp);
	    break;
	case MS_VAMPIRE:
	    {
	    /* vampire messages are varied by tameness, peacefulness, and time of night */
		boolean isnight = night();
		boolean kindred = maybe_polyd(u.umonnum == PM_VAMPIRE ||
					      u.umonnum == PM_VAMPIRE_LORD,
					      Race_if(PM_VAMPIRE));
		boolean nightchild = (Upolyd && (u.umonnum == PM_WOLF ||
				       u.umonnum == PM_WINTER_WOLF ||
				       u.umonnum == PM_WINTER_WOLF_CUB));
		const char *racenoun = (flags.female && urace.individual.f) ?
					urace.individual.f : (urace.individual.m) ?
					urace.individual.m : urace.noun;

		if (mtmp->mtame) {
			if (kindred) {
				sprintf(verbuf, "Good %s to you Master%s",
					isnight ? "evening" : "day",
					isnight ? "!" : ".  Why do we not rest?");
				verbl_msg = verbuf;
		    	} else {
		    	    sprintf(verbuf,"%s%s",
				nightchild ? "Child of the night, " : "",
				midnight() ?
					"I can stand this craving no longer!" :
				isnight ?
					"I beg you, help me satisfy this growing craving!" :
					"I find myself growing a little weary.");
				verbl_msg = verbuf;
			}
		} else if (mtmp->mpeaceful) {
			if (kindred && isnight) {
				sprintf(verbuf, "Good feeding %s!",
	    				flags.female ? "sister" : "brother");
				verbl_msg = verbuf;
 			} else if (nightchild && isnight) {
				sprintf(verbuf,
				    "How nice to hear you, child of the night!");
				verbl_msg = verbuf;
	    		} else
		    		verbl_msg = "I only drink... potions.";
    	        } else {
			int vampindex;
	    		static const char * const vampmsg[] = {
			       /* These first two (0 and 1) are specially handled below */
	    			"I vant to suck your %s!",
	    			"I vill come after %s without regret!",
		    	       /* other famous vampire quotes can follow here if desired */
	    		};
			if (kindred)
			    verbl_msg = "This is my hunting ground that you dare to prowl!";
			else if (youmonst.data == &mons[PM_SILVER_DRAGON] ||
				 youmonst.data == &mons[PM_BABY_SILVER_DRAGON]) {
			    /* Silver dragons are silver in color, not made of silver */
			    sprintf(verbuf, "%s! Your silver sheen does not frighten me!",
					youmonst.data == &mons[PM_SILVER_DRAGON] ?
					"Fool" : "Young Fool");
			    verbl_msg = verbuf; 
			} else {
			    vampindex = rn2(SIZE(vampmsg));
			    if (vampindex == 0) {
				sprintf(verbuf, vampmsg[vampindex], body_part(BLOOD));
	    			verbl_msg = verbuf;
			    } else if (vampindex == 1) {
				sprintf(verbuf, vampmsg[vampindex],
					Upolyd ? an(mons_mname(&mons[u.umonnum])) : an(racenoun));
	    			verbl_msg = verbuf;
		    	    } else
			    	verbl_msg = vampmsg[vampindex];
			}
	        }
	    }
	    break;
	case MS_WERE:
	    if (flags.moonphase == FULL_MOON && (night() ^ !rn2(13))) {
		pline("%s throws back %s head and lets out a blood curdling %s!",
		      Monnam(mtmp), mhis(level, mtmp),
		      ptr == &mons[PM_HUMAN_WERERAT] ? "shriek" : "howl");
		wake_nearto(mtmp->mx, mtmp->my, 11*11);
	    } else
		pline_msg =
		     "whispers inaudibly.  All you can make out is \"moon\".";
	    break;
	case MS_BARK:
	    if (flags.moonphase == FULL_MOON && night()) {
		pline_msg = "howls.";
	    } else if (mtmp->mpeaceful) {
		if (mtmp->mtame &&
			(mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			 moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5))
		    pline_msg = "whines.";
		else if (mtmp->mtame && EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "yips.";
		else {
		    if (mtmp->data != &mons[PM_DINGO])	/* dingos do not actually bark */
			    pline_msg = "barks.";
		}
	    } else {
		pline_msg = "growls.";
	    }
	    break;
	case MS_MEW:
	    if (mtmp->mtame) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			mtmp->mtame < 5)
		    pline_msg = "yowls.";
		else if (moves > EDOG(mtmp)->hungrytime)
		    pline_msg = "meows.";
		else if (EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "purrs.";
		else
		    pline_msg = "mews.";
		break;
	    } /* else FALLTHRU */
	case MS_GROWL:
	    if (mtmp->mtame &&
		(mtmp->data == &mons[PM_MONKEY] ||
		 mtmp->data == &mons[PM_APE] ||
		 mtmp->data == &mons[PM_CARNIVOROUS_APE])) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
		    moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5) {
		    pline_msg = "shrieks.";
		    wake_nearto(mtmp->mx, mtmp->my, 8*8);
		} else if (EDOG(mtmp)->hungrytime > moves + 1000) {
		    pline_msg = "chatters.";
		} else {
		    pline_msg = "hoots.";
		}
	    } else {
		pline_msg = mtmp->mpeaceful ? "snarls." : "growls!";
	    }
	    break;
	case MS_ROAR:
	    pline_msg = mtmp->mpeaceful ? "snarls." : "roars!";
	    break;
	case MS_SQEEK:
	    pline_msg = "squeaks.";
	    break;
	case MS_SQAWK:
	    if (ptr == &mons[PM_RAVEN] && !mtmp->mpeaceful)
	    	verbl_msg = "Nevermore!";
	    else
	    	pline_msg = "squawks.";
	    break;
	case MS_HISS:
	    if (!mtmp->mpeaceful)
		pline_msg = "hisses!";
	    else return 0;	/* no sound */
	    break;
	case MS_BUZZ:
	    pline_msg = mtmp->mpeaceful ? "drones." : "buzzes angrily.";
	    break;
	case MS_GRUNT:
	    pline_msg = "grunts.";
	    break;
	case MS_NEIGH:
	    if (mtmp->mtame < 5)
		pline_msg = "neighs.";
	    else if (moves > EDOG(mtmp)->hungrytime)
		pline_msg = "whinnies.";
	    else
		pline_msg = "whickers.";
	    break;
	case MS_WAIL:
	    pline_msg = "wails mournfully.";
	    break;
	case MS_GURGLE:
	    pline_msg = "gurgles.";
	    break;
	case MS_BURBLE:
	    pline_msg = "burbles.";
	    break;
	case MS_SHRIEK:
	    pline_msg = "shrieks.";
	    aggravate();
	    break;
	case MS_IMITATE:
	    pline_msg = "imitates you.";
	    break;
	case MS_BONES:
	    pline("%s rattles noisily.", Monnam(mtmp));
	    pline("You freeze for a moment.");
	    nomul(-2, "scared by rattling");
	    break;
	case MS_LAUGH:
	    {
		static const char * const laugh_msg[4] = {
		    "giggles.", "chuckles.", "snickers.", "laughs.",
		};
		pline_msg = laugh_msg[rn2(4)];
	    }
	    break;
	case MS_MUMBLE:
	    pline_msg = "mumbles incomprehensibly.";
	    break;
	case MS_DJINNI:
	    if (mtmp->mtame) {
		verbl_msg = "Sorry, I'm all out of wishes.";
	    } else if (mtmp->mpeaceful) {
		if (ptr == &mons[PM_WATER_DEMON])
		    pline_msg = "gurgles.";
		else
		    verbl_msg = "I'm free!";
	    } else verbl_msg = "This will teach you not to disturb me!";
	    break;
	case MS_BOAST:	/* giants */
	    if (!mtmp->mpeaceful) {
		switch (rn2(4)) {
		case 0: pline("%s boasts about %s gem collection.",
			      Monnam(mtmp), mhis(level, mtmp));
			break;
		case 1: pline_msg = "complains about a diet of mutton.";
			break;
	       default: pline_msg = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
			wake_nearto(mtmp->mx, mtmp->my, 7*7);
			break;
		}
		break;
	    }
	    /* else FALLTHRU */
	case MS_HUMANOID:
	    if (!mtmp->mpeaceful) {
		if (In_endgame(&u.uz) && is_mplayer(ptr)) {
		    mplayer_talk(mtmp);
		    break;
		} else return 0;	/* no sound */
	    }
	    /* Generic peaceful humanoid behaviour. */
	    if (mtmp->mflee)
		pline_msg = "wants nothing to do with you.";
	    else if (mtmp->mhp < mtmp->mhpmax/4)
		pline_msg = "moans.";
	    else if (mtmp->mconf || mtmp->mstun)
		verbl_msg = !rn2(3) ? "Huh?" : rn2(2) ? "What?" : "Eh?";
	    else if (!mtmp->mcansee)
		verbl_msg = "I can't see!";
	    else if (mtmp->mtrapped) {
		struct trap *t = t_at(level, mtmp->mx, mtmp->my);

		if (t) t->tseen = 1;
		verbl_msg = "I'm trapped!";
	    } else if (mtmp->mhp < mtmp->mhpmax/2)
		pline_msg = "asks for a potion of healing.";
	    else if (mtmp->mtame && !mtmp->isminion &&
						moves > EDOG(mtmp)->hungrytime)
		verbl_msg = "I'm hungry.";
	    /* Specific monsters' interests */
	    else if (is_elf(ptr))
		pline_msg = "curses orcs.";
	    else if (is_dwarf(ptr))
		pline_msg = "talks about mining.";
	    else if (likes_magic(ptr))
		pline_msg = "talks about spellcraft.";
	    else if (ptr->mlet == S_CENTAUR)
		pline_msg = "discusses hunting.";
	    else switch (monsndx(ptr)) {
		case PM_HOBBIT:
		    pline_msg = (mtmp->mhpmax - mtmp->mhp >= 10) ?
				"complains about unpleasant dungeon conditions."
				: "asks you about the One Ring.";
		    break;
		case PM_ARCHEOLOGIST:
    pline_msg = "describes a recent article in \"Spelunker Today\" magazine.";
		    break;
		case PM_TOURIST:
		    verbl_msg = "Aloha.";
		    break;
		default:
		    pline_msg = "discusses dungeon exploration.";
		    break;
	    }
	    break;
	case MS_SEDUCE:
	    if (ptr->mlet != S_NYMPH && flags.seduce_enabled &&
		could_seduce(mtmp, &youmonst, NULL) == 1) {
			doseduce(mtmp);
			break;
	    }
	    
	    switch ((poly_gender() != (int) mtmp->female) ? rn2(3) : 0)
	    {
		case 2:
			verbl_msg = "Hello, sailor.";
			break;
		case 1:
			pline_msg = "comes on to you.";
			break;
		default:
			pline_msg = "cajoles you.";
	    }
	    break;
	case MS_ARREST:
	    if (mtmp->mpeaceful)
		verbalize("Just the facts, %s.",
		      flags.female ? "Ma'am" : "Sir");
	    else {
		static const char * const arrest_msg[3] = {
		    "Anything you say can be used against you.",
		    "You're under arrest!",
		    "Stop in the name of the Law!",
		};
		verbl_msg = arrest_msg[rn2(3)];
	    }
	    break;
	case MS_BRIBE:
	    if (monsndx(ptr) == PM_PRISON_GUARD) {
		long gdemand = 500 * u.ulevel;
		long goffer = 0;

		if (!mtmp->mpeaceful && !mtmp->mtame) {
		    pline("%s demands %ld %s to avoid re-arrest.",
			  Amonnam(mtmp), gdemand, currency(gdemand));
		    if ((goffer = bribe(mtmp)) >= gdemand) {
			verbl_msg = "Good.  Now beat it, scum!";
			mtmp->mpeaceful = 1;
			set_malign(mtmp);
		    } else {
			verbalize("I said %ld!", gdemand);
			mtmp->mspec_used = 1000;
		    }
		} else {
		    verbl_msg = "Out of my way, scum!"; /* still a jerk */
		}
		break;
	    } else if (mtmp->mpeaceful && !mtmp->mtame) {
		demon_talk(mtmp);
		break;
	    }
	    /* fall through */
	case MS_CUSS:
	    if (!mtmp->mpeaceful)
		cuss(mtmp);
	    break;
	case MS_SPELL:
	    /* deliberately vague, since it's not actually casting any spell */
	    pline_msg = "seems to mutter a cantrip.";
	    break;
	case MS_NURSE:
	    if (uwep && (uwep->oclass == WEAPON_CLASS || is_weptool(uwep)))
		verbl_msg = "Put that weapon away before you hurt someone!";
	    else if (uarmc || uarm || uarmh || uarms || uarmg || uarmf)
		verbl_msg = Role_if (PM_HEALER) ?
			  "Doc, I can't help you unless you cooperate." :
			  "Please undress so I can examine you.";
	    else if (uarmu)
		verbl_msg = "Take off your shirt, please.";
	    else
		verbl_msg = "Relax, this won't hurt a bit.";
	    break;
	case MS_GUARD:
	    if (money_cnt(invent))
		verbl_msg = "Please drop that gold and follow me.";
	    else
		verbl_msg = "Please follow me.";
	    break;
	case MS_SOLDIER:
	    {
		static const char * const soldier_foe_msg[3] = {
		    "Resistance is useless!",
		    "You're dog meat!",
		    "Surrender!",
		},		  * const soldier_pax_msg[3] = {
		    "What lousy pay we're getting here!",
		    "The food's not fit for Orcs!",
		    "My feet hurt, I've been on them all day!",
		};
		verbl_msg = mtmp->mpeaceful ? soldier_pax_msg[rn2(3)]
					    : soldier_foe_msg[rn2(3)];
	    }
	    break;
	case MS_RIDER:
	    if (ptr == &mons[PM_DEATH] && !rn2(10))
		pline_msg = "is busy reading a copy of Sandman #8.";
	    else
		verbl_msg = (ptr == &mons[PM_DEATH]) ?
			 "WHO DO YOU THINK YOU ARE, WAR?" :
			 "Who do you think you are, War?";
	    break;
    }

    if (pline_msg) pline("%s %s", Monnam(mtmp), pline_msg);
    else if (verbl_msg) verbalize(verbl_msg);
    return 1;
}